

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURL * curl_easy_init(void)

{
  CURLcode CVar1;
  SessionHandle *local_20;
  SessionHandle *data;
  SessionHandle *pSStack_10;
  CURLcode res;
  
  if (initialized == 0) {
    CVar1 = curl_global_init(3);
    if (CVar1 != CURLE_OK) {
      return (CURL *)0x0;
    }
    data._4_4_ = 0;
  }
  CVar1 = Curl_open(&local_20);
  if (CVar1 == CURLE_OK) {
    pSStack_10 = local_20;
  }
  else {
    pSStack_10 = (SessionHandle *)0x0;
  }
  return pSStack_10;
}

Assistant:

CURL *curl_easy_init(void)
{
  CURLcode res;
  struct SessionHandle *data;

  /* Make sure we inited the global SSL stuff */
  if(!initialized) {
    res = curl_global_init(CURL_GLOBAL_DEFAULT);
    if(res) {
      /* something in the global init failed, return nothing */
      DEBUGF(fprintf(stderr, "Error: curl_global_init failed\n"));
      return NULL;
    }
  }

  /* We use curl_open() with undefined URL so far */
  res = Curl_open(&data);
  if(res != CURLE_OK) {
    DEBUGF(fprintf(stderr, "Error: Curl_open failed\n"));
    return NULL;
  }

  return data;
}